

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O0

int start_openssh_fixture(void)

{
  char *pcVar1;
  int local_c;
  int ret;
  
  pcVar1 = getenv("OPENSSH_NO_DOCKER");
  have_docker = (int)((pcVar1 != (char *)0x0 ^ 0xffU) & 1);
  local_c = build_openssh_server_docker_image();
  if (local_c == 0) {
    local_c = start_openssh_server(&running_container_id);
  }
  else {
    fprintf(_stderr,"Failed to build docker image\n");
  }
  return local_c;
}

Assistant:

int start_openssh_fixture(void)
{
    int ret;
#ifdef _WIN32
    WSADATA wsadata;

    ret = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(ret) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", ret);
        return 1;
    }
#endif

    have_docker = !getenv("OPENSSH_NO_DOCKER");

    ret = build_openssh_server_docker_image();
    if(!ret) {
        return start_openssh_server(&running_container_id);
    }
    else {
        fprintf(stderr, "Failed to build docker image\n");
        return ret;
    }
}